

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O3

int x25519_derive_secret
              (ptls_iovec_t *secret,uint8_t *clientpriv,uint8_t *clientpub,uint8_t *serverpriv,
              uint8_t *serverpub)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t q [32];
  cf_sha256_context h;
  uint8_t auStack_b8 [40];
  cf_sha256_context local_90;
  
  puVar1 = serverpub;
  if (clientpriv == (uint8_t *)0x0) {
    puVar1 = clientpub;
    clientpriv = serverpriv;
  }
  cf_curve25519_mul(auStack_b8,clientpriv,puVar1);
  puVar1 = (uint8_t *)malloc(0x20);
  secret->base = puVar1;
  if (puVar1 == (uint8_t *)0x0) {
    iVar2 = 0x201;
  }
  else {
    secret->len = 0x20;
    cf_sha256_init(&local_90);
    cf_sha256_update(&local_90,auStack_b8,0x20);
    cf_sha256_update(&local_90,clientpub,0x20);
    cf_sha256_update(&local_90,serverpub,0x20);
    cf_sha256_digest_final(&local_90,secret->base);
    iVar2 = 0;
  }
  (*ptls_clear_memory)(auStack_b8,0x20);
  return iVar2;
}

Assistant:

static int x25519_derive_secret(ptls_iovec_t *secret, const uint8_t *clientpriv, const uint8_t *clientpub,
                                const uint8_t *serverpriv, const uint8_t *serverpub)
{
    uint8_t q[X25519_KEY_SIZE];
    cf_sha256_context h;
    int ret;

    cf_curve25519_mul(q, clientpriv != NULL ? clientpriv : serverpriv, clientpriv != NULL ? serverpub : clientpub);

    if ((secret->base = malloc(CF_SHA256_HASHSZ)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    secret->len = CF_SHA256_HASHSZ;

    cf_sha256_init(&h);
    cf_sha256_update(&h, q, X25519_KEY_SIZE);
    cf_sha256_update(&h, clientpub, X25519_KEY_SIZE);
    cf_sha256_update(&h, serverpub, X25519_KEY_SIZE);
    cf_sha256_digest_final(&h, secret->base);

    ret = 0;
Exit:
    ptls_clear_memory(q, sizeof(q));
    return ret;
}